

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O0

void nn_ep_set_error(nn_ep *self,int errnum)

{
  int in_ESI;
  long in_RDI;
  nn_sock *unaff_retaddr;
  nn_ep *in_stack_00000018;
  nn_sock *in_stack_00000020;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(int *)(in_RDI + 0x110) != in_ESI) {
    if (*(int *)(in_RDI + 0x110) == 0) {
      nn_sock_stat_increment
                (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                 CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
    *(int *)(in_RDI + 0x110) = in_ESI;
    nn_sock_report_error(in_stack_00000020,in_stack_00000018,self._4_4_);
  }
  return;
}

Assistant:

void nn_ep_set_error(struct nn_ep *self, int errnum)
{
    if (self->last_errno == errnum)
        /*  Error is still there, no need to report it again  */
        return;
    if (self->last_errno == 0)
        nn_sock_stat_increment (self->sock, NN_STAT_CURRENT_EP_ERRORS, 1);
    self->last_errno = errnum;
    nn_sock_report_error (self->sock, self, errnum);
}